

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall VectorsTest_FP3ProductScalar_Test::TestBody(VectorsTest_FP3ProductScalar_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FP3 res2;
  FP3 res1;
  FP3 v1;
  Vector3<double> *in_stack_fffffffffffffd68;
  Vector3<double> *in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  double *expected;
  char *in_stack_fffffffffffffd80;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int line;
  char *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  Type TVar2;
  AssertHelper *in_stack_fffffffffffffda0;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined1 uVar3;
  AssertHelper *in_stack_fffffffffffffdd0;
  Vector3<double> local_1a8;
  AssertionResult local_190 [2];
  Vector3<double> local_170;
  AssertionResult local_158 [2];
  Vector3<double> local_138;
  AssertionResult local_120 [2];
  Vector3<double> local_100;
  AssertionResult local_e8 [2];
  Vector3<double> local_c8;
  AssertionResult local_b0;
  uint local_9c;
  Vector3<double> local_78;
  AssertionResult local_60;
  undefined1 local_48 [8];
  double local_40 [4];
  Vector3<double> local_20;
  
  TVar2 = (Type)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  pica::Vector3<double>::Vector3(&local_20,3.0,5.0,-2.0);
  pica::operator*(in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68);
  pica::operator*((double)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  pica::Vector3<double>::Vector3(&local_78,15.0,25.0,-10.0);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->x);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1e30c6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffda0,TVar2,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
               in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdd0,
               (Message *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    testing::Message::~Message((Message *)0x1e3129);
  }
  local_9c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3197);
  if (local_9c == 0) {
    pica::Vector3<double>::Vector3(&local_c8,15.0,25.0,-10.0);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->x);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffda0);
      testing::AssertionResult::failure_message((AssertionResult *)0x1e3280);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffda0,TVar2,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c
                 ,in_stack_fffffffffffffd80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdd0,
                 (Message *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
      testing::Message::~Message((Message *)0x1e32e3);
    }
    local_9c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3351);
    if (local_9c == 0) {
      pica::Vector3<double>::Vector3(&local_100,15.0,25.0,-10.0);
      testing::internal::EqHelper<false>::Compare<double,double>
                ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->x);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffda0);
        in_stack_fffffffffffffdd0 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1e342e);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffda0,TVar2,in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffdd0,
                   (Message *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
        testing::Message::~Message((Message *)0x1e348b);
      }
      local_9c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e34f9);
      if (local_9c == 0) {
        pica::Vector3<double>::Vector3(&local_138,15.0,25.0,-10.0);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,&in_stack_fffffffffffffd70->x
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
        uVar3 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffda0);
          testing::AssertionResult::failure_message((AssertionResult *)0x1e35c8);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffda0,TVar2,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffdd0,(Message *)CONCAT17(uVar3,in_stack_fffffffffffffdc8))
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
          testing::Message::~Message((Message *)0x1e3625);
        }
        local_9c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3693);
        if (local_9c == 0) {
          TVar2 = (Type)((ulong)local_48 >> 0x20);
          pica::Vector3<double>::Vector3(&local_170,15.0,25.0,-10.0);
          this_02 = local_158;
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                     &in_stack_fffffffffffffd70->x);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
          if (!bVar1) {
            testing::Message::Message((Message *)this_02);
            in_stack_fffffffffffffd90 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x1e376a);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffd90,
                       in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffdd0,
                       (Message *)CONCAT17(uVar3,in_stack_fffffffffffffdc8));
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd70);
            testing::Message::~Message((Message *)0x1e37c7);
          }
          local_9c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e3835);
          if (local_9c == 0) {
            expected = local_40;
            pica::Vector3<double>::Vector3(&local_1a8,15.0,25.0,-10.0);
            this_01 = local_190;
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                       &this_01->success_,expected,&in_stack_fffffffffffffd70->x);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
            line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd8c);
            if (!bVar1) {
              testing::Message::Message((Message *)this_02);
              this_00 = (AssertHelper *)
                        testing::AssertionResult::failure_message((AssertionResult *)0x1e390c);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffd90,line,
                         &this_01->success_);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffdd0,
                         (Message *)CONCAT17(uVar3,in_stack_fffffffffffffdc8));
              testing::internal::AssertHelper::~AssertHelper(this_00);
              testing::Message::~Message((Message *)0x1e3969);
            }
            local_9c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e39d4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3ProductScalar)
{
    FP3 v1(3, 5, -2);
    FP3 res1 = v1 * 5.0;
    FP3 res2 = 5.0 * v1;
    ASSERT_EQ_FP3(res1, FP3(15, 25, -10));
    ASSERT_EQ_FP3(res2, FP3(15, 25, -10));
}